

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFPageLabelDocumentHelper::getLabelForPage(QPDFPageLabelDocumentHelper *this,longlong page_idx)

{
  bool bVar1;
  numtree_number in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  QPDFObjectHandle QVar3;
  longlong start;
  QPDFObjectHandle label;
  QPDFObjectHandle St;
  numtree_number offset;
  QPDFObjectHandle P;
  QPDFObjectHandle S;
  allocator<char> local_a1;
  string local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff68;
  longlong local_80;
  undefined1 local_78 [24];
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  numtree_number local_40;
  QPDFObjectHandle local_38;
  QPDFObjectHandle local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  QVar3 = QPDFObjectHandle::newNull();
  _Var2._M_pi = QVar3.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((QPDFNumberTreeObjectHelper *)**(undefined8 **)(page_idx + 0x10) !=
      (QPDFNumberTreeObjectHelper *)0x0) {
    local_40 = 0;
    local_78._0_8_ = (element_type *)0x0;
    local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar1 = QPDFNumberTreeObjectHelper::findObjectAtOrBelow
                      ((QPDFNumberTreeObjectHelper *)**(undefined8 **)(page_idx + 0x10),in_RDX,
                       (QPDFObjectHandle *)local_78,&local_40);
    if (bVar1) {
      bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_78);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_a0,"/S",(allocator<char> *)&local_38);
        QPDFObjectHandle::getKey(&local_28,(string *)local_78);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_a0,"/P",(allocator<char> *)&local_50);
        QPDFObjectHandle::getKey(&local_38,(string *)local_78);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_a0,"/St",(allocator<char> *)&local_60);
        QPDFObjectHandle::getKey(&local_50,(string *)local_78);
        std::__cxx11::string::~string(local_a0);
        local_80 = 1;
        bVar1 = QPDFObjectHandle::isInteger(&local_50);
        if (bVar1) {
          local_80 = QPDFObjectHandle::getIntValue(&local_50);
        }
        QIntC::range_check<long_long>(&local_80,&local_40);
        local_80 = local_80 + local_40;
        QPDFObjectHandle::newDictionary();
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_a0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff68);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_a0,"/S",(allocator<char> *)&local_60);
        QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,(string *)local_a0,&local_28);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_a0,"/P",(allocator<char> *)&local_60);
        QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,(string *)local_a0,&local_38);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::string<std::allocator<char>>(local_a0,"/St",&local_a1);
        QPDFObjectHandle::newInteger((longlong)in_stack_ffffffffffffff68._M_pi);
        QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,(string *)local_a0,&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_60.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string(local_a0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_50.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_38.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_28.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    _Var2._M_pi = extraout_RDX;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageLabelDocumentHelper::getLabelForPage(long long page_idx)
{
    QPDFObjectHandle result(QPDFObjectHandle::newNull());
    if (!hasPageLabels()) {
        return result;
    }
    QPDFNumberTreeObjectHelper::numtree_number offset = 0;
    QPDFObjectHandle label;
    if (!m->labels->findObjectAtOrBelow(page_idx, label, offset)) {
        return result;
    }
    if (!label.isDictionary()) {
        return result;
    }
    QPDFObjectHandle S = label.getKey("/S");   // type (D, R, r, A, a)
    QPDFObjectHandle P = label.getKey("/P");   // prefix
    QPDFObjectHandle St = label.getKey("/St"); // starting number
    long long start = 1;
    if (St.isInteger()) {
        start = St.getIntValue();
    }
    QIntC::range_check(start, offset);
    start += offset;
    result = QPDFObjectHandle::newDictionary();
    result.replaceKey("/S", S);
    result.replaceKey("/P", P);
    result.replaceKey("/St", QPDFObjectHandle::newInteger(start));
    return result;
}